

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

ON_SubDEdgeSharpness __thiscall
ON_SubDEdge::SubdivideSharpness(ON_SubDEdge *this,ON_SubDVertex *end_vertex,bool bReverse)

{
  int end_index;
  ON_SubDEdgeSharpness OVar1;
  float fVar2;
  ON_SubDEdgeSharpness local_10;
  
  if (end_vertex == (ON_SubDVertex *)0x0) {
LAB_005d305e:
    OVar1.m_edge_sharpness[0] = 0.0;
    OVar1.m_edge_sharpness[1] = 0.0;
  }
  else {
    if (this->m_vertex[0] == end_vertex) {
      local_10 = Sharpness(this,false);
      end_index = 0;
    }
    else {
      if (this->m_vertex[1] != end_vertex) goto LAB_005d305e;
      local_10 = Sharpness(this,false);
      end_index = 1;
    }
    OVar1 = ON_SubDEdgeSharpness::Subdivided(&local_10,end_index);
    if (bReverse) {
      fVar2 = OVar1.m_edge_sharpness[1];
      OVar1.m_edge_sharpness[1] = OVar1.m_edge_sharpness[0];
      OVar1.m_edge_sharpness[0] = fVar2;
    }
  }
  return (ON_SubDEdgeSharpness)OVar1.m_edge_sharpness;
}

Assistant:

const ON_SubDEdgeSharpness ON_SubDEdge::SubdivideSharpness(
  const class ON_SubDVertex* end_vertex,
  bool bReverse
) const
{
  if (nullptr != end_vertex)
  {
    if (end_vertex == this->m_vertex[0])
      return this->SubdivideSharpness(0U, bReverse);
    if (end_vertex == this->m_vertex[1])
      return this->SubdivideSharpness(1U, bReverse);
  }
  return ON_SubDEdgeSharpness::Smooth;
}